

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall cppcms::widgets::select_base::element::element(element *this,element *other)

{
  uint uVar1;
  pointer pcVar2;
  
  uVar1 = *(uint *)other;
  *(uint *)this = *(uint *)this & 0xfffffffe | uVar1 & 1;
  *(uint *)this = *(uint *)other & 0xfffffffe | uVar1 & 1;
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  pcVar2 = (other->id)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->id,pcVar2,pcVar2 + (other->id)._M_string_length);
  (this->str_option)._M_dataplus._M_p = (pointer)&(this->str_option).field_2;
  pcVar2 = (other->str_option)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->str_option,pcVar2,pcVar2 + (other->str_option)._M_string_length);
  booster::locale::basic_message<char>::basic_message(&this->tr_option,&other->tr_option);
  (this->d).ptr_ = (_data *)0x0;
  return;
}

Assistant:

select_base::element::element(select_base::element const &other) : 
	need_translation(other.need_translation),
	reserved(other.reserved),
	id(other.id),
	str_option(other.str_option),
	tr_option(other.tr_option)
{
}